

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::FBXConverter::MakeUniqueNodeName_abi_cxx11_
          (string *__return_storage_ptr__,FBXConverter *this,Model *model,aiNode *parent)

{
  aiString *paVar1;
  ulong uVar2;
  char *pcVar3;
  string original_name;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  string local_40;
  
  FixNodeName(&local_40,this,&(model->super_Object).name);
  if (local_40._M_string_length == 0) {
    pcVar3 = (char *)0x0;
    uVar2 = 0;
    while ((parent != (aiNode *)0x0 && (uVar2 == 0 || pcVar3 == (char *)0x0))) {
      pcVar3 = (parent->mName).data;
      paVar1 = &parent->mName;
      parent = parent->mParent;
      uVar2 = (ulong)paVar1->length;
    }
    local_60 = local_50;
    if (uVar2 == 0 || pcVar3 == (char *)0x0) {
      local_58 = 0;
      local_50[0] = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar3,pcVar3 + uVar2);
    }
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GetUniqueName(this,&local_40,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::MakeUniqueNodeName(const Model* const model, const aiNode& parent)
        {
            std::string original_name = FixNodeName(model->Name());
            if (original_name.empty())
            {
                original_name = getAncestorBaseName(&parent);
            }
            std::string unique_name;
            GetUniqueName(original_name, unique_name);
            return unique_name;
        }